

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  DistributionMapping *dm;
  _func_int **pp_Var1;
  long lVar2;
  FabFactory<amrex::FArrayBox> *factory;
  pointer pSVar3;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> factory_00;
  FArrayBox *pFVar4;
  FArrayBox *pFVar5;
  AmrLevel *pAVar6;
  Box *pBVar7;
  Box *pBVar8;
  Geometry *pGVar9;
  Real *pRVar10;
  int *piVar11;
  bool bVar12;
  IndexType typ;
  int iVar13;
  int iVar14;
  MultiFab *this_00;
  DeriveRec *pDVar15;
  DeriveBoxMap p_Var16;
  FabArrayBase *fabarray_;
  int *piVar17;
  pointer *ppbVar18;
  DeriveFunc p_Var19;
  DeriveFunc3D p_Var20;
  int *piVar21;
  pointer *ppbVar22;
  int iVar23;
  BoxArray *rhs;
  int dcomp;
  long lVar24;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int index;
  DeriveRec *local_378;
  int scomp;
  AmrLevel *local_368;
  int ncomp;
  AmrLevel *local_358;
  Box *local_350;
  Box *local_348;
  Real time_local;
  int n_state;
  int n_der;
  int grid_no;
  Geometry *local_328;
  FabArrayBase *local_320;
  Box bx1;
  pointer local_2f8;
  int local_2f0;
  Vector<int,_std::allocator<int>_> *local_2e0;
  Vector<int,_std::allocator<int>_> *local_2d8;
  int *local_2b8;
  Real *local_2b0;
  IntVect *local_2a8;
  double *local_2a0;
  double *local_298;
  int *local_290;
  int *local_288;
  Real dt;
  Box local_274;
  RealBox *local_258;
  int *local_250;
  RealBox temp;
  MultiFab srcMF;
  BoxArray dstBA;
  
  time_local = (Real)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  this->_vptr_AmrLevel = (_func_int **)0x0;
  local_358 = this;
  bVar12 = isStateVariable((string *)key,&index,&scomp);
  iVar13 = (int)keylen;
  if (bVar12) {
    lVar24 = (long)index;
    lVar2 = *(long *)(ctx + 0x170);
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x1
    ;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
    factory = *(FabFactory<amrex::FArrayBox> **)(ctx + 0x218);
    this_00 = (MultiFab *)operator_new(0x180);
    MultiFab::MultiFab(this_00,(BoxArray *)(lVar2 + lVar24 * 0xe0 + 0x30),
                       (DistributionMapping *)(ctx + 0x140),1,iVar13,(MFInfo *)&srcMF,factory);
    pAVar6 = local_358;
    local_358->_vptr_AmrLevel = (_func_int **)this_00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                  m_bndryReg.m_typ);
    FillPatch((AmrLevel *)ctx,this_00,iVar13,time_local,index,scomp,1,0);
    local_358 = pAVar6;
  }
  else {
    local_368 = (AmrLevel *)ctx;
    pDVar15 = DeriveList::get((DeriveList *)&derive_lst,(string *)key);
    if (pDVar15 == (DeriveRec *)0x0) {
      pp_Var1 = (_func_int **)
                ((long)&srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                        m_op + 4);
      srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&srcMF,"AmrLevel::derive(MultiFab*): unknown variable: ","");
      std::__cxx11::string::_M_append((char *)&srcMF,*(ulong *)key);
      Error_host((char *)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         _vptr_FabArrayBase);
      if (srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase != pp_Var1) {
        operator_delete(srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
                        ,srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                         m_op._4_8_ + 1);
      }
    }
    else {
      DeriveRec::getRange(pDVar15,0,&index,&scomp,&ncomp);
      iVar23 = index;
      local_350 = (Box *)CONCAT44(local_350._4_4_,iVar13);
      pSVar3 = (local_368->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      rhs = (BoxArray *)((long)(pSVar3 + index) + 0x30);
      BoxArray::BoxArray(&dstBA,rhs);
      typ = DeriveRec::deriveType(pDVar15);
      BoxArray::convert(&dstBA,typ);
      BATransformer::operator()
                ((Box *)&srcMF,(BATransformer *)rhs,
                 (Box *)**(undefined8 **)((long)(pSVar3 + iVar23) + 0x78));
      p_Var16 = DeriveRec::boxMap(pDVar15);
      (*p_Var16)(&bx1,(Box *)&srcMF);
      pAVar6 = local_368;
      iVar23 = ((int)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase -
               bx1.smallend.vect[0]) + (int)local_350;
      dm = &local_368->dmap;
      iVar13 = DeriveRec::numState(pDVar15);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffd00 = (pointer)0x0;
      local_2f8 = (pointer)0x0;
      local_348 = (Box *)dm;
      MultiFab::MultiFab(&srcMF,rhs,dm,iVar13,iVar23,(MFInfo *)&bx1,
                         (pAVar6->m_factory)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      iVar13 = DeriveRec::numRange(pDVar15);
      local_378 = pDVar15;
      if (0 < iVar13) {
        iVar13 = 0;
        dcomp = 0;
        do {
          DeriveRec::getRange(pDVar15,iVar13,&index,&scomp,&ncomp);
          FillPatch(local_368,&srcMF,iVar23,time_local,index,scomp,ncomp,dcomp);
          pDVar15 = local_378;
          iVar13 = iVar13 + 1;
          dcomp = dcomp + ncomp;
          iVar14 = DeriveRec::numRange(local_378);
        } while (iVar13 < iVar14);
      }
      iVar13 = DeriveRec::numDerive(pDVar15);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffd00 = (pointer)0x0;
      local_2f8 = (pointer)0x0;
      factory_00._M_head_impl =
           (local_368->m_factory)._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
      fabarray_ = (FabArrayBase *)operator_new(0x180);
      MultiFab::MultiFab((MultiFab *)fabarray_,&dstBA,(DistributionMapping *)local_348,iVar13,
                         (int)local_350,(MFInfo *)&bx1,factory_00._M_head_impl);
      local_358->_vptr_AmrLevel = (_func_int **)fabarray_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      DeriveRec::derFuncFab((DeriveFuncFab *)&bx1,local_378);
      local_320 = fabarray_;
      if (bx1.bigend.vect._4_8_ == 0) {
        MFIter::MFIter((MFIter *)&bx1,fabarray_,true);
        if ((int)local_2f8 < local_2f0) {
          local_258 = &(local_368->geom).prob_domain;
          local_2b8 = &local_368->level;
          local_2b0 = (local_368->geom).super_CoordSys.dx;
          pDVar15 = local_378;
          do {
            ppbVar22 = &local_2f8;
            grid_no = (local_2e0->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[(int)local_2f8];
            ppbVar18 = ppbVar22;
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar18 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            local_298 = BaseFab<double>::dataPtr
                                  (*(BaseFab<double> **)
                                    (*(long *)((long)&fabarray_[1].boxarray.m_bat.m_op + 0xc) +
                                    (long)*(int *)ppbVar18 * 8),0);
            ppbVar18 = ppbVar22;
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar18 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            lVar2 = *(long *)((long)&fabarray_[1].boxarray.m_bat.m_op + 0xc);
            lVar24 = *(long *)(lVar2 + (long)*(int *)ppbVar18 * 8);
            ppbVar18 = ppbVar22;
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar18 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            lVar2 = *(long *)(lVar2 + (long)*(int *)ppbVar18 * 8);
            MFIter::growntilebox(&local_274,(MFIter *)&bx1,-1000000);
            n_der = DeriveRec::numDerive(pDVar15);
            ppbVar18 = ppbVar22;
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar18 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            local_2a0 = BaseFab<double>::dataPtr
                                  (&srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar18]->
                                    super_BaseFab<double>,0);
            ppbVar18 = ppbVar22;
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar18 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            pFVar4 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar18];
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar22 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            local_290 = (int *)(lVar24 + 0x18);
            local_288 = (int *)(lVar2 + 0x24);
            local_348 = &(pFVar4->super_BaseFab<double>).domain;
            pFVar5 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar22];
            local_2a8 = &(pFVar5->super_BaseFab<double>).domain.bigend;
            n_state = DeriveRec::numState(pDVar15);
            pAVar6 = local_368;
            pSVar3 = (local_368->state).
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_350 = (Box *)((long)(pSVar3 + index) + 0x10);
            local_328 = (Geometry *)((long)(pSVar3 + index) + 0x1c);
            local_250 = DeriveRec::getBC(local_378);
            pRVar10 = local_2b0;
            RealBox::RealBox(&temp,&local_274,local_2b0,local_258->xlo);
            pDVar15 = local_378;
            dt = (pAVar6->parent->dt_level).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[pAVar6->level];
            p_Var19 = DeriveRec::derFunc(local_378);
            piVar11 = local_288;
            piVar17 = local_290;
            pGVar9 = local_328;
            pBVar8 = local_348;
            pBVar7 = local_350;
            if (p_Var19 == (DeriveFunc)0x0) {
              p_Var20 = DeriveRec::derFunc3D(pDVar15);
              if (p_Var20 == (DeriveFunc3D)0x0) {
                Error_host("AmrLevel::derive: no function available");
              }
              else {
                piVar21 = DeriveRec::getBC3D(pDVar15);
                p_Var20 = DeriveRec::derFunc3D(local_378);
                pDVar15 = local_378;
                (*p_Var20)(local_298,piVar17,piVar11,&n_der,local_2a0,(int *)pBVar8,local_2a8->vect,
                           &n_state,(int *)&local_274,local_274.bigend.vect,(int *)pBVar7,
                           (int *)pGVar9,local_2b0,temp.xlo,&time_local,&dt,piVar21,local_2b8,
                           &grid_no);
              }
            }
            else {
              p_Var19 = DeriveRec::derFunc(pDVar15);
              pDVar15 = local_378;
              (*p_Var19)(local_298,local_290,(int *)(lVar24 + 0x1c),(int *)(lVar24 + 0x20),local_288
                         ,(int *)(lVar2 + 0x28),(int *)(lVar2 + 0x2c),&n_der,local_2a0,
                         (int *)local_348,(pFVar4->super_BaseFab<double>).domain.smallend.vect + 1,
                         (pFVar4->super_BaseFab<double>).domain.smallend.vect + 2,local_2a8->vect,
                         (pFVar5->super_BaseFab<double>).domain.bigend.vect + 1,
                         (pFVar5->super_BaseFab<double>).domain.bigend.vect + 2,&n_state,
                         (int *)&local_274,local_274.bigend.vect,(int *)local_350,(int *)local_328,
                         pRVar10,temp.xlo,&time_local,&dt,local_250,local_2b8,&grid_no);
            }
            fabarray_ = local_320;
            MFIter::operator++((MFIter *)&bx1);
          } while ((int)local_2f8 < local_2f0);
        }
      }
      else {
        (*(code *)bx1.bigend.vect._4_8_)(&bx1,&bx1,3);
        MFIter::MFIter((MFIter *)&bx1,fabarray_,true);
        if ((int)local_2f8 < local_2f0) {
          local_328 = &local_368->geom;
          do {
            MFIter::growntilebox(&local_274,(MFIter *)&bx1,(int)local_350);
            pDVar15 = local_378;
            ppbVar18 = &local_2f8;
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar18 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            pFVar4 = *(FArrayBox **)
                      (*(long *)((long)&local_320[1].boxarray.m_bat.m_op + 0xc) +
                      (long)*(int *)ppbVar18 * 8);
            ppbVar18 = &local_2f8;
            if (local_2d8 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar18 = (pointer *)
                         ((local_2d8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2f8);
            }
            pFVar5 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar18];
            DeriveRec::derFuncFab((DeriveFuncFab *)&temp,local_378);
            local_348 = (Box *)time_local;
            piVar17 = DeriveRec::getBC(pDVar15);
            std::
            function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
            ::operator()((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                          *)&temp,&local_274,pFVar4,0,iVar13,pFVar5,local_328,(double)local_348,
                         piVar17,local_368->level);
            if (temp.xlo[2] != 0.0) {
              (*(code *)temp.xlo[2])(&temp,&temp,3);
            }
            MFIter::operator++((MFIter *)&bx1);
          } while ((int)local_2f8 < local_2f0);
        }
      }
      MFIter::~MFIter((MFIter *)&bx1);
      MultiFab::~MultiFab(&srcMF);
      BoxArray::~BoxArray(&dstBA);
    }
  }
  return (int)local_358;
}

Assistant:

std::unique_ptr<MultiFab>
AmrLevel::derive (const std::string& name, Real time, int ngrow)
{
    BL_ASSERT(ngrow >= 0);

    std::unique_ptr<MultiFab> mf;

    int index, scomp, ncomp;

    if (isStateVariable(name, index, scomp))
    {
        mf = std::make_unique<MultiFab>(state[index].boxArray(), dmap, 1, ngrow, MFInfo(), *m_factory);
        FillPatch(*this,*mf,ngrow,time,index,scomp,1,0);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0, index, scomp, ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        BoxArray dstBA(srcBA);
        dstBA.convert(rec->deriveType());

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA, dmap, rec->numState(), ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k, index, scomp, ncomp);
            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        const int dncomp = rec->numDerive();
        mf = std::make_unique<MultiFab>(dstBA, dmap, dncomp, ngrow, MFInfo(), *m_factory);

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(ngrow);
                FArrayBox& derfab = (*mf)[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                rec->derFuncFab()(bx, derfab, 0, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*mf,true); mfi.isValid(); ++mfi)
        {
            int         grid_no = mfi.index();
            Real*       ddat    = (*mf)[mfi].dataPtr();
            const int*  dlo     = (*mf)[mfi].loVect();
            const int*  dhi     = (*mf)[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox temp    (gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&grid_no);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&grid_no);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }

    return mf;
}